

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::io::(anonymous_namespace)::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::io::(anonymous_namespace)::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test>
             *this)

{
  Test *this_00;
  ParameterizedTestFactory<google::protobuf::io::(anonymous_namespace)::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test>
  *this_local;
  
  WithParamInterface<int>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x18);
  google::protobuf::io::anon_unknown_0::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test::
  BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test
            ((BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }